

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::LogicalType::printTo(LogicalType *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  string local_248 [39];
  byte local_221;
  string local_220 [39];
  byte local_1f9;
  string local_1f8 [39];
  byte local_1d1;
  string local_1d0 [39];
  byte local_1a9;
  string local_1a8 [16];
  TimestampType *in_stack_fffffffffffffe68;
  string local_180 [39];
  byte local_159;
  string local_158 [39];
  byte local_131;
  string local_130 [39];
  byte local_109;
  string local_108 [39];
  byte local_e1;
  string local_e0 [39];
  byte local_b9;
  string local_b8 [39];
  byte local_91;
  string local_90 [39];
  byte local_69;
  string local_68 [55];
  byte local_31;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"LogicalType(");
  std::operator<<(local_10,"STRING=");
  poVar1 = local_10;
  local_31 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::StringType>
              ((StringType *)in_stack_fffffffffffffe68);
    local_31 = 1;
    std::operator<<(poVar1,local_30);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"MAP=");
  poVar1 = local_10;
  local_69 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 1 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::MapType>((MapType *)in_stack_fffffffffffffe68);
    local_69 = 1;
    std::operator<<(poVar1,local_68);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"LIST=");
  poVar1 = local_10;
  local_91 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 2 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::ListType>
              ((ListType *)in_stack_fffffffffffffe68);
    local_91 = 1;
    std::operator<<(poVar1,local_90);
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"ENUM=");
  poVar1 = local_10;
  local_b9 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 3 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EnumType>
              ((EnumType *)in_stack_fffffffffffffe68);
    local_b9 = 1;
    std::operator<<(poVar1,local_b8);
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string(local_b8);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"DECIMAL=");
  poVar1 = local_10;
  local_e1 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 4 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DecimalType>
              ((DecimalType *)in_stack_fffffffffffffe68);
    local_e1 = 1;
    std::operator<<(poVar1,local_e0);
  }
  if ((local_e1 & 1) != 0) {
    std::__cxx11::string::~string(local_e0);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"DATE=");
  poVar1 = local_10;
  local_109 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 5 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DateType>
              ((DateType *)in_stack_fffffffffffffe68);
    local_109 = 1;
    std::operator<<(poVar1,local_108);
  }
  if ((local_109 & 1) != 0) {
    std::__cxx11::string::~string(local_108);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"TIME=");
  poVar1 = local_10;
  local_131 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 6 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TimeType>
              ((TimeType *)in_stack_fffffffffffffe68);
    local_131 = 1;
    std::operator<<(poVar1,local_130);
  }
  if ((local_131 & 1) != 0) {
    std::__cxx11::string::~string(local_130);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"TIMESTAMP=");
  poVar1 = local_10;
  local_159 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 7 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TimestampType>(in_stack_fffffffffffffe68);
    local_159 = 1;
    std::operator<<(poVar1,local_158);
  }
  if ((local_159 & 1) != 0) {
    std::__cxx11::string::~string(local_158);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"INTEGER=");
  poVar1 = local_10;
  if ((*(ushort *)(in_RDI + 0xe8) >> 8 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::IntType>((IntType *)in_stack_fffffffffffffe68);
    std::operator<<(poVar1,local_180);
    std::__cxx11::string::~string(local_180);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"UNKNOWN=");
  poVar1 = local_10;
  local_1a9 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 9 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::NullType>
              ((NullType *)in_stack_fffffffffffffe68);
    local_1a9 = 1;
    std::operator<<(poVar1,local_1a8);
  }
  if ((local_1a9 & 1) != 0) {
    std::__cxx11::string::~string(local_1a8);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"JSON=");
  poVar1 = local_10;
  local_1d1 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 10 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::JsonType>
              ((JsonType *)in_stack_fffffffffffffe68);
    local_1d1 = 1;
    std::operator<<(poVar1,local_1d0);
  }
  if ((local_1d1 & 1) != 0) {
    std::__cxx11::string::~string(local_1d0);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"BSON=");
  poVar1 = local_10;
  local_1f9 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 0xb & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::BsonType>
              ((BsonType *)in_stack_fffffffffffffe68);
    local_1f9 = 1;
    std::operator<<(poVar1,local_1f8);
  }
  if ((local_1f9 & 1) != 0) {
    std::__cxx11::string::~string(local_1f8);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"UUID=");
  poVar1 = local_10;
  local_221 = 0;
  if ((*(ushort *)(in_RDI + 0xe8) >> 0xc & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::UUIDType>
              ((UUIDType *)in_stack_fffffffffffffe68);
    local_221 = 1;
    std::operator<<(poVar1,local_220);
  }
  if ((local_221 & 1) != 0) {
    std::__cxx11::string::~string(local_220);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"FLOAT16=");
  poVar1 = local_10;
  if ((*(ushort *)(in_RDI + 0xe8) >> 0xd & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Float16Type>
              ((Float16Type *)in_stack_fffffffffffffe68);
    std::operator<<(poVar1,local_248);
    std::__cxx11::string::~string(local_248);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void LogicalType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "LogicalType(";
  out << "STRING="; (__isset.STRING ? (out << to_string(STRING)) : (out << "<null>"));
  out << ", " << "MAP="; (__isset.MAP ? (out << to_string(MAP)) : (out << "<null>"));
  out << ", " << "LIST="; (__isset.LIST ? (out << to_string(LIST)) : (out << "<null>"));
  out << ", " << "ENUM="; (__isset.ENUM ? (out << to_string(ENUM)) : (out << "<null>"));
  out << ", " << "DECIMAL="; (__isset.DECIMAL ? (out << to_string(DECIMAL)) : (out << "<null>"));
  out << ", " << "DATE="; (__isset.DATE ? (out << to_string(DATE)) : (out << "<null>"));
  out << ", " << "TIME="; (__isset.TIME ? (out << to_string(TIME)) : (out << "<null>"));
  out << ", " << "TIMESTAMP="; (__isset.TIMESTAMP ? (out << to_string(TIMESTAMP)) : (out << "<null>"));
  out << ", " << "INTEGER="; (__isset.INTEGER ? (out << to_string(INTEGER)) : (out << "<null>"));
  out << ", " << "UNKNOWN="; (__isset.UNKNOWN ? (out << to_string(UNKNOWN)) : (out << "<null>"));
  out << ", " << "JSON="; (__isset.JSON ? (out << to_string(JSON)) : (out << "<null>"));
  out << ", " << "BSON="; (__isset.BSON ? (out << to_string(BSON)) : (out << "<null>"));
  out << ", " << "UUID="; (__isset.UUID ? (out << to_string(UUID)) : (out << "<null>"));
  out << ", " << "FLOAT16="; (__isset.FLOAT16 ? (out << to_string(FLOAT16)) : (out << "<null>"));
  out << ")";
}